

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O1

bool anon_unknown.dwarf_16dbda5::WorkflowStepTypeHelper(Type *out,Value *value,cmJSONState *state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  String local_50;
  
  if (value == (Value *)0x0) {
    cmCMakePresetsErrors::INVALID_PRESET((Value *)0x0,state);
    return false;
  }
  bVar2 = Json::Value::isString(value);
  if (bVar2) {
    Json::Value::asString_abi_cxx11_(&local_50,value);
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      *out = Configure;
    }
    else {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        *out = Build;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_50,value);
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == 0) {
          *out = Test;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_50,value);
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (iVar3 != 0) {
            cmCMakePresetsErrors::INVALID_PRESET(value,state);
            goto LAB_003fd514;
          }
          *out = Package;
        }
      }
    }
    bVar2 = true;
  }
  else {
LAB_003fd514:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool WorkflowStepTypeHelper(WorkflowPreset::WorkflowStep::Type& out,
                            const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (!value->isString()) {
    return false;
  }

  if (value->asString() == "configure") {
    out = WorkflowPreset::WorkflowStep::Type::Configure;
    return true;
  }

  if (value->asString() == "build") {
    out = WorkflowPreset::WorkflowStep::Type::Build;
    return true;
  }

  if (value->asString() == "test") {
    out = WorkflowPreset::WorkflowStep::Type::Test;
    return true;
  }

  if (value->asString() == "package") {
    out = WorkflowPreset::WorkflowStep::Type::Package;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}